

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void ym2413_reset_chip(void *chip)

{
  YM2413 *OPLL;
  void *chip_local;
  
  OPLLResetChip((YM2413 *)chip);
  return;
}

Assistant:

static void ym2413_reset_chip(void *chip)
{
	YM2413 *OPLL = (YM2413 *)chip;
	OPLLResetChip(OPLL);
}